

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv_os_getenv(char *name,char *buffer,size_t *size)

{
  ulong uVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  size_t __n;
  
  iVar2 = -0x16;
  if ((size != (size_t *)0x0 && (buffer != (char *)0x0 && name != (char *)0x0)) &&
     (uVar1 = *size, uVar1 != 0)) {
    __s = getenv(name);
    if (__s == (char *)0x0) {
      iVar2 = -2;
    }
    else {
      sVar3 = strlen(__s);
      __n = sVar3 + 1;
      if (sVar3 < uVar1) {
        memcpy(buffer,__s,__n);
        iVar2 = 0;
        __n = sVar3;
      }
      else {
        iVar2 = -0x69;
      }
      *size = __n;
    }
  }
  return iVar2;
}

Assistant:

int uv_os_getenv(const char* name, char* buffer, size_t* size) {
  char* var;
  size_t len;

  if (name == NULL || buffer == NULL || size == NULL || *size == 0)
    return -EINVAL;

  var = getenv(name);

  if (var == NULL)
    return -ENOENT;

  len = strlen(var);

  if (len >= *size) {
    *size = len + 1;
    return -ENOBUFS;
  }

  memcpy(buffer, var, len + 1);
  *size = len;

  return 0;
}